

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O2

Color4<double> *
Imath_3_2::hsv2rgb<double>(Color4<double> *__return_storage_ptr__,Color4<double> *hsv)

{
  Color4<double> c;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_38 = hsv->r;
  dStack_30 = hsv->g;
  local_28 = hsv->b;
  dStack_20 = hsv->a;
  Imath_3_2::hsv2rgb_d((Color4 *)&local_58);
  __return_storage_ptr__->r = local_58;
  __return_storage_ptr__->g = dStack_50;
  __return_storage_ptr__->b = local_48;
  __return_storage_ptr__->a = dStack_40;
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Color4<T>
                                   hsv2rgb (const Color4<T>& hsv) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Color4<double> v = Color4<double> (
            hsv.r / float (std::numeric_limits<T>::max ()),
            hsv.g / float (std::numeric_limits<T>::max ()),
            hsv.b / float (std::numeric_limits<T>::max ()),
            hsv.a / float (std::numeric_limits<T>::max ()));
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> (
            (T) (c.r * std::numeric_limits<T>::max ()),
            (T) (c.g * std::numeric_limits<T>::max ()),
            (T) (c.b * std::numeric_limits<T>::max ()),
            (T) (c.a * std::numeric_limits<T>::max ()));
    }
    else
    {
        Color4<double> v = Color4<double> (hsv.r, hsv.g, hsv.b, hsv.a);
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> ((T) c.r, (T) c.g, (T) c.b, (T) c.a);
    }
}